

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

string * __thiscall
cmNinjaTargetGenerator::ComputeDefines
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,cmSourceFile *source,
          string *language,string *config)

{
  cmLocalNinjaGenerator *pcVar1;
  cmGeneratorTarget *headTarget;
  int iVar2;
  cmGlobalNinjaGenerator *pcVar3;
  cmValue cVar4;
  string *psVar5;
  string COMPILE_DEFINITIONS;
  string defPropName;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defines;
  cmGeneratorExpressionInterpreter genexInterpreter;
  string sStack_1b8;
  string *local_198;
  string local_190;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_170;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  cmGeneratorExpressionInterpreter local_a0;
  
  local_170._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_170._M_impl.super__Rb_tree_header._M_header;
  local_170._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_170._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_170._M_impl.super__Rb_tree_header._M_node_count = 0;
  pcVar1 = this->LocalGenerator;
  local_198 = __return_storage_ptr__;
  local_170._M_impl.super__Rb_tree_header._M_header._M_right =
       local_170._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string((string *)&local_c0,(string *)config);
  headTarget = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  std::__cxx11::string::string((string *)&local_e0,(string *)language);
  cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
            (&local_a0,(cmLocalGenerator *)pcVar1,&local_c0,headTarget,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  pcVar3 = GetGlobalGenerator(this);
  iVar2 = (*(pcVar3->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
            [0x28])(pcVar3);
  if ((char)iVar2 != '\0') {
    local_190._M_dataplus._M_p._0_1_ = 0x22;
    cmStrCat<char_const(&)[15],std::__cxx11::string_const&,char>
              (&sStack_1b8,(char (*) [15])"CMAKE_INTDIR=\"",config,(char *)&local_190);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&local_170,&sStack_1b8);
    std::__cxx11::string::~string((string *)&sStack_1b8);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_1b8,"COMPILE_DEFINITIONS",(allocator<char> *)&local_190);
  cVar4 = cmSourceFile::GetProperty(source,&sStack_1b8);
  if (cVar4.Value != (string *)0x0) {
    pcVar1 = this->LocalGenerator;
    std::__cxx11::string::string((string *)&local_100,(string *)cVar4.Value);
    psVar5 = cmGeneratorExpressionInterpreter::Evaluate(&local_a0,&local_100,&sStack_1b8);
    cmLocalGenerator::AppendDefines
              ((cmLocalGenerator *)pcVar1,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_170,psVar5);
    std::__cxx11::string::~string((string *)&local_100);
  }
  cmsys::SystemTools::UpperCase(&local_120,config);
  cmStrCat<char_const(&)[21],std::__cxx11::string>
            (&local_190,(char (*) [21])"COMPILE_DEFINITIONS_",&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  cVar4 = cmSourceFile::GetProperty(source,&local_190);
  if (cVar4.Value != (string *)0x0) {
    pcVar1 = this->LocalGenerator;
    std::__cxx11::string::string((string *)&local_140,(string *)cVar4.Value);
    psVar5 = cmGeneratorExpressionInterpreter::Evaluate(&local_a0,&local_140,&sStack_1b8);
    cmLocalGenerator::AppendDefines
              ((cmLocalGenerator *)pcVar1,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_170,psVar5);
    std::__cxx11::string::~string((string *)&local_140);
  }
  psVar5 = local_198;
  cmCommonTargetGenerator::GetDefines
            (local_198,&this->super_cmCommonTargetGenerator,language,config);
  cmLocalGenerator::JoinDefines
            ((cmLocalGenerator *)this->LocalGenerator,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_170,psVar5,language);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&sStack_1b8);
  cmGeneratorExpressionInterpreter::~cmGeneratorExpressionInterpreter(&local_a0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_170);
  return psVar5;
}

Assistant:

std::string cmNinjaTargetGenerator::ComputeDefines(cmSourceFile const* source,
                                                   const std::string& language,
                                                   const std::string& config)
{
  std::set<std::string> defines;
  cmGeneratorExpressionInterpreter genexInterpreter(
    this->LocalGenerator, config, this->GeneratorTarget, language);

  // Seriously??
  if (this->GetGlobalGenerator()->IsMultiConfig()) {
    defines.insert(cmStrCat("CMAKE_INTDIR=\"", config, '"'));
  }

  const std::string COMPILE_DEFINITIONS("COMPILE_DEFINITIONS");
  if (cmValue compile_defs = source->GetProperty(COMPILE_DEFINITIONS)) {
    this->LocalGenerator->AppendDefines(
      defines, genexInterpreter.Evaluate(*compile_defs, COMPILE_DEFINITIONS));
  }

  std::string defPropName =
    cmStrCat("COMPILE_DEFINITIONS_", cmSystemTools::UpperCase(config));
  if (cmValue config_compile_defs = source->GetProperty(defPropName)) {
    this->LocalGenerator->AppendDefines(
      defines,
      genexInterpreter.Evaluate(*config_compile_defs, COMPILE_DEFINITIONS));
  }

  std::string definesString = this->GetDefines(language, config);
  this->LocalGenerator->JoinDefines(defines, definesString, language);

  return definesString;
}